

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

ATTACH_HANDLE attach_create(char *name_value,handle handle_value,role role_value)

{
  int iVar1;
  ATTACH_HANDLE __ptr;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  AMQP_VALUE item_value_00;
  AMQP_VALUE value_00;
  ATTACH_INSTANCE *attach_instance;
  bool bVar2;
  
  __ptr = (ATTACH_HANDLE)malloc(8);
  if (__ptr != (ATTACH_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x12);
    __ptr->composite_value = value;
    if (value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_create_string(name_value);
      iVar1 = amqpvalue_set_composite_item(value,0,item_value);
      item_value_00 = amqpvalue_create_uint(handle_value);
      bVar2 = iVar1 == 0;
      if (bVar2) {
        iVar1 = amqpvalue_set_composite_item(value,1,item_value_00);
        bVar2 = iVar1 == 0;
      }
      value_00 = amqpvalue_create_boolean(role_value);
      if (bVar2) {
        iVar1 = amqpvalue_set_composite_item(value,2,value_00);
        amqpvalue_destroy(item_value);
        amqpvalue_destroy(item_value_00);
        amqpvalue_destroy(value_00);
        if (iVar1 == 0) {
          return __ptr;
        }
      }
      else {
        amqpvalue_destroy(item_value);
        amqpvalue_destroy(item_value_00);
        amqpvalue_destroy(value_00);
      }
      amqpvalue_destroy(value);
    }
    free(__ptr);
  }
  return (ATTACH_HANDLE)0x0;
}

Assistant:

ATTACH_HANDLE attach_create(const char* name_value, handle handle_value, role role_value)
{
    ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)malloc(sizeof(ATTACH_INSTANCE));
    if (attach_instance != NULL)
    {
        attach_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(18);
        if (attach_instance->composite_value == NULL)
        {
            free(attach_instance);
            attach_instance = NULL;
        }
        else
        {
            AMQP_VALUE name_amqp_value;
            AMQP_VALUE handle_amqp_value;
            AMQP_VALUE role_amqp_value;
            int result = 0;

            name_amqp_value = amqpvalue_create_string(name_value);
            if ((result == 0) && (amqpvalue_set_composite_item(attach_instance->composite_value, 0, name_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            handle_amqp_value = amqpvalue_create_handle(handle_value);
            if ((result == 0) && (amqpvalue_set_composite_item(attach_instance->composite_value, 1, handle_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            role_amqp_value = amqpvalue_create_role(role_value);
            if ((result == 0) && (amqpvalue_set_composite_item(attach_instance->composite_value, 2, role_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(name_amqp_value);
            amqpvalue_destroy(handle_amqp_value);
            amqpvalue_destroy(role_amqp_value);
            if (result != 0)
            {
                attach_destroy(attach_instance);
                attach_instance = NULL;
            }
        }
    }

    return attach_instance;
}